

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_dup_keys(lyd_node *new_list,lyd_node *old_list,lys_node *skip_key,ly_ctx *log_ctx,
                int options)

{
  lys_node *plVar1;
  bool bVar2;
  int iVar3;
  lyd_node *node;
  ushort local_52;
  uint16_t i;
  lyd_node *key_dup;
  lyd_node *key;
  lys_node_list *slist;
  int options_local;
  ly_ctx *log_ctx_local;
  lys_node *skip_key_local;
  lyd_node *old_list_local;
  lyd_node *new_list_local;
  
  if (new_list->schema->nodetype != LYS_LIST) {
    return 0;
  }
  plVar1 = new_list->schema;
  key_dup = old_list->child;
  local_52 = 0;
  do {
    bVar2 = false;
    if (key_dup != (lyd_node *)0x0) {
      bVar2 = local_52 < plVar1->padding[2];
    }
    if (!bVar2) {
      if ((key_dup == (lyd_node *)0x0) && (local_52 < plVar1->padding[2])) {
        ly_vlog(log_ctx,LYE_PATH_INKEY,LY_VLOG_LYD,new_list,
                **(undefined8 **)(*(long *)&plVar1[1].flags + (ulong)local_52 * 8));
        return -1;
      }
      return 0;
    }
    if (key_dup->schema != *(lys_node **)(*(long *)&plVar1[1].flags + (ulong)local_52 * 8)) {
      ly_vlog(log_ctx,LYE_PATH_INKEY,LY_VLOG_LYD,new_list,
              **(undefined8 **)(*(long *)&plVar1[1].flags + (ulong)local_52 * 8));
      return -1;
    }
    if (key_dup->schema != skip_key) {
      node = lyd_dup(key_dup,options & 2);
      if (node == (lyd_node *)0x0) {
        ly_log(log_ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyd_dup_keys");
        return -1;
      }
      iVar3 = lyd_insert(new_list,node);
      if (iVar3 != 0) {
        lyd_free(node);
        return -1;
      }
    }
    local_52 = local_52 + 1;
    key_dup = key_dup->next;
  } while( true );
}

Assistant:

static int
lyd_dup_keys(struct lyd_node *new_list, const struct lyd_node *old_list, struct lys_node *skip_key,
        struct ly_ctx *log_ctx, int options)
{
    struct lys_node_list *slist;
    struct lyd_node *key, *key_dup;
    uint16_t i;

    if (new_list->schema->nodetype != LYS_LIST) {
        return 0;
    }

    slist = (struct lys_node_list *)new_list->schema;
    for (key = old_list->child, i = 0; key && (i < slist->keys_size); ++i, key = key->next) {
        if (key->schema != (struct lys_node *)slist->keys[i]) {
            LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
            return -1;
        }
        if (key->schema == skip_key) {
            continue;
        }

        key_dup = lyd_dup(key, options & LYD_DUP_OPT_NO_ATTR);
        LY_CHECK_ERR_RETURN(!key_dup, LOGMEM(log_ctx), -1);

        if (lyd_insert(new_list, key_dup)) {
            lyd_free(key_dup);
            return -1;
        }
    }
    if (!key && (i < slist->keys_size)) {
        LOGVAL(log_ctx, LYE_PATH_INKEY, LY_VLOG_LYD, new_list, slist->keys[i]->name);
        return -1;
    }

    return 0;
}